

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *
statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,string *statistic)

{
  int iVar1;
  const_iterator cVar2;
  logic_error *this;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  sum_fn local_184;
  median_fn local_183;
  mean_fn local_182;
  max_fn local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
  local_160 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
  local_60;
  
  if (statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
      ::statistic_functions_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
                                 ::statistic_functions_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
      ::pair<const_char_(&)[4],_min_fn,_true>(local_160,(char (*) [4])"min",(min_fn *)&local_180);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
      ::pair<const_char_(&)[4],_max_fn,_true>(local_160 + 1,(char (*) [4])"max",&local_181);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
      ::pair<const_char_(&)[5],_mean_fn,_true>(local_160 + 2,(char (*) [5])"mean",&local_182);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
      ::pair<const_char_(&)[7],_median_fn,_true>(local_160 + 3,(char (*) [7])"median",&local_183);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
      ::pair<const_char_(&)[4],_sum_fn,_true>
                (&local_60,(char (*) [4])(anon_var_dwarf_fc327 + 0x85),&local_184);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _Hashtable<std::pair<std::__cxx11::string_const,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
                     ::statistic_functions_abi_cxx11_,local_160,&stack0xffffffffffffffe0,0,
                 &local_185,&local_186,&local_187);
      lVar3 = 0x100;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>
                 *)((long)&local_160[0].first._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>_>_>
                   ::~unordered_map,
                   &statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
                    ::statistic_functions_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
                           ::statistic_functions_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(std::__cxx11::string_const&)
                  ::statistic_functions_abi_cxx11_._M_h,statistic);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
    ::function(__return_storage_ptr__,
               (function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
                *)((long)cVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>_>,_true>
                         ._M_cur + 0x28));
    return __return_storage_ptr__;
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,anon_var_dwarf_fd862,anon_var_dwarf_fd862 + 0x27);
  std::operator+(&local_160[0].first,&local_180,statistic);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)local_160);
  *(undefined ***)this = &PTR__logic_error_001a4588;
  __cxa_throw(this,&boost::program_options::error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

statistic_function_for_t<Duration> statistic_for (const std::string & statistic)
{
    static const auto statistic_functions =
        std::unordered_map<std::string, statistic_function_for_t<Duration>>
        {
            {"min", min_fn{}},
            {"max", max_fn{}},
            {"mean", mean_fn{}},
            {"median", median_fn{}},
            {"sum", sum_fn{}}
        };

    auto stat_function = statistic_functions.find(statistic);
    if (stat_function != statistic_functions.end())
    {
        return stat_function->second;
    }
    else
    {
        auto error_message = u8"Неверная статистика: "_u8s + statistic;
        throw boost::program_options::error(error_message);
    }
}